

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

void ecpDblJA3(word *b,word *a,ec_o *ec,void *stack)

{
  word *a_00;
  word *a_01;
  word *pwVar1;
  word *b_00;
  word *b_01;
  size_t n;
  bool_t bVar2;
  word *c;
  
  n = ec->f->n;
  a_00 = a + n;
  a_01 = a_00 + n;
  bVar2 = wwIsZero(a_01,n);
  if (bVar2 == 0) {
    bVar2 = wwIsZero(a_00,ec->f->n);
    if (bVar2 == 0) {
      c = (word *)(n * 8 + (long)stack);
      pwVar1 = c + n;
      (*ec->f->sqr)((word *)stack,a_01,ec->f,pwVar1);
      b_00 = b + n;
      b_01 = b_00 + n;
      (*ec->f->mul)(b_01,a_00,a_01,ec->f,pwVar1);
      zzDoubleMod(b_01,b_01,ec->f->mod,ec->f->n);
      zzSubMod(c,a,(word *)stack,ec->f->mod,ec->f->n);
      zzAddMod((word *)stack,a,(word *)stack,ec->f->mod,ec->f->n);
      (*ec->f->mul)(c,(word *)stack,c,ec->f,pwVar1);
      zzDoubleMod((word *)stack,c,ec->f->mod,ec->f->n);
      zzAddMod((word *)stack,(word *)stack,c,ec->f->mod,ec->f->n);
      zzDoubleMod(b_00,a_00,ec->f->mod,ec->f->n);
      (*ec->f->sqr)(b_00,b_00,ec->f,pwVar1);
      (*ec->f->sqr)(c,b_00,ec->f,pwVar1);
      zzHalfMod(c,c,ec->f->mod,ec->f->n);
      (*ec->f->mul)(b_00,b_00,a,ec->f,pwVar1);
      (*ec->f->sqr)(b,(word *)stack,ec->f,pwVar1);
      zzSubMod(b,b,b_00,ec->f->mod,ec->f->n);
      zzSubMod(b,b,b_00,ec->f->mod,ec->f->n);
      zzSubMod(b_00,b_00,b,ec->f->mod,ec->f->n);
      (*ec->f->mul)(b_00,b_00,(word *)stack,ec->f,pwVar1);
      zzSubMod(b_00,b_00,c,ec->f->mod,ec->f->n);
      return;
    }
  }
  wwSetZero(b + n * 2,ec->f->n);
  return;
}

Assistant:

static void ecpDblJA3(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// za == 0 или ya == 0? => b <- O
	if (qrIsZero(ecZ(a, n), ec->f) || qrIsZero(ecY(a, n), ec->f))
	{
		qrSetZero(ecZ(b, n), ec->f);
		return;
	}
	// t1 <- za^2
	qrSqr(t1, ecZ(a, n), ec->f, stack);
	// zb <- ya za
	qrMul(ecZ(b, n), ecY(a, n), ecZ(a, n), ec->f, stack);
	// zb <- 2 zb
	gfpDouble(ecZ(b, n), ecZ(b, n), ec->f);
	// t2 <- xa - t1
	zmSub(t2, ecX(a), t1, ec->f);
	// t1 <- xa + t1
	zmAdd(t1, ecX(a), t1, ec->f);
	// t2 <- t1 t2
	qrMul(t2, t1, t2, ec->f, stack);
	// t1 <- 2 t2
	gfpDouble(t1, t2, ec->f);
	// t1 <- t1 + t2
	zmAdd(t1, t1, t2, ec->f);
	// yb <- 2 ya
	gfpDouble(ecY(b, n), ecY(a, n), ec->f);
	// yb <- yb^2
	qrSqr(ecY(b, n), ecY(b, n), ec->f, stack);
	// t2 <- yb^2
	qrSqr(t2, ecY(b, n), ec->f, stack);
	// t2 <- t2 / 2
	gfpHalf(t2, t2, ec->f);
	// yb <- yb xa
	qrMul(ecY(b, n), ecY(b, n), ecX(a), ec->f, stack);
	// xb <- t1^2
	qrSqr(ecX(b), t1, ec->f, stack);
	// xb <- xb - yb
	zmSub(ecX(b), ecX(b), ecY(b, n), ec->f);
	// xb <- xb - yb
	zmSub(ecX(b), ecX(b), ecY(b, n), ec->f);
	// yb <- yb - xb
	zmSub(ecY(b, n), ecY(b, n), ecX(b), ec->f);
	// yb <- yb t1
	qrMul(ecY(b, n), ecY(b, n), t1, ec->f, stack);
	// yb <- yb - t2
	zmSub(ecY(b, n), ecY(b, n), t2, ec->f);
}